

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void expr_field(LexState *ls,ExpDesc *v)

{
  FuncState *fs;
  anon_union_8_3_2ce71dea_for_u local_38;
  undefined8 local_30;
  undefined4 local_28;
  
  fs = ls->fs;
  expr_toanyreg(fs,v);
  lj_lex_next(ls);
  local_30 = 0xffffffff00000003;
  local_28 = 0xffffffff;
  local_38.sval = lex_str(ls);
  expr_index(fs,v,(ExpDesc *)&local_38.s);
  return;
}

Assistant:

static void expr_field(LexState *ls, ExpDesc *v)
{
  FuncState *fs = ls->fs;
  ExpDesc key;
  expr_toanyreg(fs, v);
  lj_lex_next(ls);  /* Skip dot or colon. */
  expr_str(ls, &key);
  expr_index(fs, v, &key);
}